

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_buf.c
# Opt level: O3

SBuf * lj_buf_putstr_rep(SBuf *sb,GCstr *s,int32_t rep)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  GCstr *pGVar4;
  GCstr *pGVar5;
  uint sz;
  ulong uVar6;
  char *__s;
  ulong __n;
  GCstr *pGVar7;
  
  uVar1 = s->len;
  if (uVar1 != 0 && 0 < rep) {
    __n = (ulong)(uint)rep;
    uVar6 = __n * uVar1;
    if (0x7fffff00 < uVar6) {
      lj_err_mem((lua_State *)(ulong)(sb->L).ptr32);
    }
    uVar2 = (sb->p).ptr32;
    __s = (char *)(ulong)uVar2;
    sz = (uint)uVar6;
    if ((sb->e).ptr32 - uVar2 < sz) {
      __s = lj_buf_more2(sb,sz);
    }
    pGVar7 = s + 1;
    if (uVar1 == 1) {
      memset(__s,(uint)(byte)(pGVar7->nextgc).gcptr32,__n);
      __s = __s + __n;
    }
    else {
      pGVar4 = pGVar7;
      do {
        do {
          pGVar5 = (GCstr *)((long)&(pGVar4->nextgc).gcptr32 + 1);
          *__s = (char)(pGVar4->nextgc).gcptr32;
          __s = __s + 1;
          pGVar4 = pGVar5;
        } while (pGVar5 < (GCstr *)((long)&(pGVar7->nextgc).gcptr32 + (ulong)uVar1));
        bVar3 = 1 < rep;
        pGVar4 = pGVar7;
        rep = rep + -1;
      } while (bVar3);
    }
    (sb->p).ptr32 = (uint32_t)__s;
  }
  return sb;
}

Assistant:

SBuf *lj_buf_putstr_rep(SBuf *sb, GCstr *s, int32_t rep)
{
  MSize len = s->len;
  if (rep > 0 && len) {
    uint64_t tlen = (uint64_t)rep * len;
    char *p;
    if (LJ_UNLIKELY(tlen > LJ_MAX_STR))
      lj_err_mem(sbufL(sb));
    p = lj_buf_more(sb, (MSize)tlen);
    if (len == 1) {  /* Optimize a common case. */
      uint32_t c = strdata(s)[0];
      do { *p++ = c; } while (--rep > 0);
    } else {
      const char *e = strdata(s) + len;
      do {
	const char *q = strdata(s);
	do { *p++ = *q++; } while (q < e);
      } while (--rep > 0);
    }
    setsbufP(sb, p);
  }
  return sb;
}